

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  int iVar14;
  float fVar15;
  undefined1 auVar16 [16];
  
  uVar2 = a->c;
  iVar10 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar14 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar9 = 0; uVar9 != uVar2; uVar9 = uVar9 + 1) {
      pvVar3 = a->data;
      sVar4 = a->elemsize;
      sVar5 = a->cstep;
      pauVar13 = (undefined1 (*) [16])(sVar5 * uVar9 * sVar4 + (long)pvVar3);
      fVar1 = *b->data;
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pauVar12 = (undefined1 (*) [16])(sVar8 * uVar9 * sVar7 + (long)pvVar6);
      lVar11 = 0;
      for (iVar14 = 0; iVar14 + 3 < iVar10; iVar14 = iVar14 + 4) {
        auVar16._4_4_ = fVar1;
        auVar16._0_4_ = fVar1;
        auVar16._8_4_ = fVar1;
        auVar16._12_4_ = fVar1;
        auVar16 = minps(*pauVar13,auVar16);
        *pauVar12 = auVar16;
        pauVar13 = pauVar13 + 1;
        pauVar12 = pauVar12 + 1;
        lVar11 = lVar11 + 4;
      }
      for (; (int)lVar11 < iVar10; lVar11 = lVar11 + 1) {
        fVar15 = *(float *)((long)pvVar3 + lVar11 * 4 + sVar5 * sVar4 * uVar9);
        if (fVar1 <= fVar15) {
          fVar15 = fVar1;
        }
        *(float *)((long)pvVar6 + lVar11 * 4 + sVar8 * sVar7 * uVar9) = fVar15;
      }
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}